

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCapsuleShape.cpp
# Opt level: O1

btVector3 __thiscall
btCapsuleShape::localGetSupportingVertexWithoutMargin(btCapsuleShape *this,btVector3 *vec0)

{
  undefined8 uVar1;
  int iVar2;
  float fVar3;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar4;
  float fVar5;
  float fVar6;
  btVector3 bVar7;
  btScalar local_78 [2];
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  float fStack_30;
  float fStack_2c;
  undefined1 local_28 [16];
  float local_18;
  float fStack_14;
  undefined8 uStack_10;
  
  uVar1 = *(undefined8 *)vec0->m_floats;
  local_68._0_4_ = (float)uVar1;
  local_68._4_4_ = (float)((ulong)uVar1 >> 0x20);
  uStack_60._0_4_ = 0.0;
  uStack_60._4_4_ = 0.0;
  fVar5 = vec0->m_floats[2];
  fVar3 = fVar5 * fVar5 + (float)local_68 * (float)local_68 + local_68._4_4_ * local_68._4_4_;
  if (0.0001 <= fVar3) {
    if (fVar3 < 0.0) {
      uStack_60 = 0;
      local_68 = uVar1;
      fVar3 = sqrtf(fVar3);
    }
    else {
      fVar3 = SQRT(fVar3);
    }
    fVar3 = 1.0 / fVar3;
    fVar5 = fVar5 * fVar3;
    local_68._0_4_ = (float)local_68 * fVar3;
    local_68._4_4_ = local_68._4_4_ * fVar3;
    uStack_60._0_4_ = (float)uStack_60 * fVar3;
    uStack_60._4_4_ = uStack_60._4_4_ * fVar3;
  }
  else {
    local_68._0_4_ = 1.0;
    local_68._4_4_ = 0.0;
    uStack_60._0_4_ = 0.0;
    uStack_60._4_4_ = 0.0;
    fVar5 = 0.0;
  }
  iVar2 = *(int *)&(this->super_btConvexInternalShape).field_0x44;
  fVar3 = (this->super_btConvexInternalShape).m_implicitShapeDimensions.m_floats[(iVar2 + 2) % 3];
  _local_38 = ZEXT416((uint)fVar3);
  local_78[0] = 0.0;
  local_78[1] = 0.0;
  uStack_70 = 0;
  local_78[iVar2] = (this->super_btConvexInternalShape).m_implicitShapeDimensions.m_floats[iVar2];
  fVar3 = fVar5 * fVar3;
  local_48 = ZEXT416((uint)fVar3);
  local_58 = ZEXT416((uint)((float)uStack_70 + fVar3));
  (*(this->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
    _vptr_btCollisionShape[0xc])(this);
  fVar3 = (float)local_38._0_4_ * (float)local_68;
  local_38._4_4_ = (float)local_38._0_4_ * local_68._4_4_;
  fStack_30 = (float)local_38._0_4_ * (float)uStack_60;
  fStack_2c = (float)local_38._0_4_ * uStack_60._4_4_;
  local_38._0_4_ = fVar3;
  local_18 = (local_78[0] + fVar3) - extraout_XMM0_Da * (float)local_68;
  fStack_14 = (local_78[1] + (float)local_38._4_4_) - extraout_XMM0_Da * local_68._4_4_;
  fVar3 = (float)local_58._0_4_ - fVar5 * extraout_XMM0_Da;
  fVar4 = fVar5 * fVar3 + (float)local_68 * local_18 + local_68._4_4_ * fStack_14;
  if (-1e+18 < fVar4) {
    uStack_10 = CONCAT44((fStack_2c + 0.0) - extraout_XMM0_Da * uStack_60._4_4_,
                         (fStack_30 + 0.0) - extraout_XMM0_Da * (float)uStack_60);
  }
  else {
    fVar3 = 0.0;
    local_18 = 0.0;
    fStack_14 = 0.0;
    uStack_10 = 0;
  }
  local_28 = ZEXT416((uint)fVar3);
  if (fVar4 <= -1e+18) {
    fVar4 = -1e+18;
  }
  local_58._0_4_ = fVar4;
  local_78[0] = 0.0;
  local_78[1] = 0.0;
  uStack_70 = 0;
  iVar2 = *(int *)&(this->super_btConvexInternalShape).field_0x44;
  local_78[iVar2] = -(this->super_btConvexInternalShape).m_implicitShapeDimensions.m_floats[iVar2];
  local_48._0_4_ = (float)local_48._0_4_ + (float)uStack_70;
  (*(this->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
    _vptr_btCollisionShape[0xc])(this);
  fVar3 = ((float)local_38._0_4_ + local_78[0]) - extraout_XMM0_Da_00 * (float)local_68;
  fVar4 = ((float)local_38._4_4_ + local_78[1]) - extraout_XMM0_Da_00 * local_68._4_4_;
  fVar6 = (float)local_48._0_4_ - fVar5 * extraout_XMM0_Da_00;
  if ((float)local_58._0_4_ < fVar5 * fVar6 + (float)local_68 * fVar3 + local_68._4_4_ * fVar4) {
    local_28._4_4_ = 0;
  }
  else {
    fVar3 = local_18;
    fVar4 = fStack_14;
    fVar6 = (float)local_28._0_4_;
  }
  bVar7.m_floats[1] = fVar4;
  bVar7.m_floats[0] = fVar3;
  bVar7.m_floats[3] = (btScalar)local_28._4_4_;
  bVar7.m_floats[2] = fVar6;
  return (btVector3)bVar7.m_floats;
}

Assistant:

btVector3	btCapsuleShape::localGetSupportingVertexWithoutMargin(const btVector3& vec0)const
{

	btVector3 supVec(0,0,0);

	btScalar maxDot(btScalar(-BT_LARGE_FLOAT));

	btVector3 vec = vec0;
	btScalar lenSqr = vec.length2();
	if (lenSqr < btScalar(0.0001))
	{
		vec.setValue(1,0,0);
	} else
	{
		btScalar rlen = btScalar(1.) / btSqrt(lenSqr );
		vec *= rlen;
	}

	btVector3 vtx;
	btScalar newDot;
	
	btScalar radius = getRadius();


	{
		btVector3 pos(0,0,0);
		pos[getUpAxis()] = getHalfHeight();

		vtx = pos +vec*(radius) - vec * getMargin();
		newDot = vec.dot(vtx);
		if (newDot > maxDot)
		{
			maxDot = newDot;
			supVec = vtx;
		}
	}
	{
		btVector3 pos(0,0,0);
		pos[getUpAxis()] = -getHalfHeight();

		vtx = pos +vec*(radius) - vec * getMargin();
		newDot = vec.dot(vtx);
		if (newDot > maxDot)
		{
			maxDot = newDot;
			supVec = vtx;
		}
	}

	return supVec;

}